

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_HILO(DisasContext_conflict6 *ctx,uint32_t opc,int acc,int reg)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 pTVar1;
  TCGv_i64 pTVar2;
  TCGOpcode opc_00;
  
  if ((opc & 0xfffffffd) == 0x10 && reg == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  if ((acc != 0) && ((ctx->hflags & 0x80000) == 0)) {
    gen_HILO_cold_1();
  }
  switch(opc) {
  case 0x10:
    pTVar2 = tcg_ctx->cpu_gpr[reg];
    if (acc != 0) {
      pTVar1 = tcg_ctx->cpu_HI[(uint)acc];
      goto LAB_009a6ac7;
    }
    pTVar1 = tcg_ctx->cpu_HI[0];
    break;
  case 0x11:
    if (reg == 0) {
      pTVar2 = tcg_ctx->cpu_HI[(uint)acc];
LAB_009a6b18:
      pTVar2 = (TCGv_i64)((long)&tcg_ctx->pool_cur + (long)pTVar2);
      opc_00 = INDEX_op_movi_i64;
      pTVar1 = (TCGv_i64)0x0;
      goto LAB_009a6b59;
    }
    if (acc == 0) {
      pTVar2 = tcg_ctx->cpu_HI[0];
LAB_009a6b37:
      if (pTVar2 == tcg_ctx->cpu_gpr[reg]) {
        return;
      }
      pTVar2 = pTVar2 + (long)tcg_ctx;
      pTVar1 = tcg_ctx->cpu_gpr[reg] + (long)tcg_ctx;
      opc_00 = INDEX_op_mov_i64;
      goto LAB_009a6b59;
    }
    pTVar2 = tcg_ctx->cpu_HI[(uint)acc];
    goto LAB_009a6ab9;
  case 0x12:
    pTVar2 = tcg_ctx->cpu_gpr[reg];
    if (acc != 0) {
      pTVar1 = tcg_ctx->cpu_LO[(uint)acc];
      goto LAB_009a6ac7;
    }
    pTVar1 = tcg_ctx->cpu_LO[0];
    break;
  case 0x13:
    if (reg == 0) {
      pTVar2 = tcg_ctx->cpu_LO[(uint)acc];
      goto LAB_009a6b18;
    }
    if (acc == 0) {
      pTVar2 = tcg_ctx->cpu_LO[0];
      goto LAB_009a6b37;
    }
    pTVar2 = tcg_ctx->cpu_LO[(uint)acc];
LAB_009a6ab9:
    pTVar1 = tcg_ctx->cpu_gpr[reg];
LAB_009a6ac7:
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,pTVar2,pTVar1);
    return;
  default:
    goto switchD_009a6a47_default;
  }
  if (pTVar2 == pTVar1) {
switchD_009a6a47_default:
    return;
  }
  pTVar2 = pTVar2 + (long)tcg_ctx;
  pTVar1 = pTVar1 + (long)tcg_ctx;
  opc_00 = INDEX_op_mov_i64;
LAB_009a6b59:
  tcg_gen_op2_mips64el(tcg_ctx,opc_00,(TCGArg)pTVar2,(TCGArg)pTVar1);
  return;
}

Assistant:

static void gen_HILO(DisasContext *ctx, uint32_t opc, int acc, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (reg == 0 && (opc == OPC_MFHI || opc == OPC_MFLO)) {
        /* Treat as NOP. */
        return;
    }

    if (acc != 0) {
        check_dsp(ctx);
    }

    switch (opc) {
    case OPC_MFHI:
#if defined(TARGET_MIPS64)
        if (acc != 0) {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[acc]);
        } else
#endif
        {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[acc]);
        }
        break;
    case OPC_MFLO:
#if defined(TARGET_MIPS64)
        if (acc != 0) {
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[acc]);
        } else
#endif
        {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[acc]);
        }
        break;
    case OPC_MTHI:
        if (reg != 0) {
#if defined(TARGET_MIPS64)
            if (acc != 0) {
                tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_gpr[reg]);
            } else
#endif
            {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], tcg_ctx->cpu_gpr[reg]);
            }
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], 0);
        }
        break;
    case OPC_MTLO:
        if (reg != 0) {
#if defined(TARGET_MIPS64)
            if (acc != 0) {
                tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_gpr[reg]);
            } else
#endif
            {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_gpr[reg]);
            }
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], 0);
        }
        break;
    }
}